

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PlotFileUtil.cpp
# Opt level: O0

void amrex::EB_WriteMultiLevelPlotfile
               (string *plotfilename,int nlevels,
               Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *mf,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *geom,Real time,
               Vector<int,_std::allocator<int>_> *level_steps,
               Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *ref_ratio,
               string *versionName,string *levelPrefix,string *mfPrefix,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *extra_dirs)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  _Ios_Openmode __a;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  Long LVar8;
  MultiFab **ppMVar9;
  BoxArray *dst;
  BoxArray *bxs;
  FabFactory<amrex::FArrayBox> *pFVar10;
  int in_ESI;
  BoxArray *in_stack_00000008;
  EBFArrayBoxFactory *in_stack_00000010;
  undefined8 in_stack_00000028;
  EBFArrayBoxFactory *factory;
  MultiFab mf_tmp;
  int nc;
  int level_1;
  int lev;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vn;
  int level;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> boxArrays;
  ofstream HeaderFile;
  string HeaderFileName;
  IO_Buffer io_buffer;
  string ed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *d;
  const_iterator __end2;
  const_iterator __begin2;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool callBarrier;
  int finest_level;
  undefined1 in_stack_00000953;
  How in_stack_00000954;
  string *in_stack_00000958;
  FabArray<amrex::FArrayBox> *in_stack_00000960;
  BoxArray *in_stack_fffffffffffff9e8;
  EBFArrayBoxFactory *in_stack_fffffffffffff9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f8;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffa00;
  int in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa0c;
  MFInfo *in_stack_fffffffffffffa10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa18;
  BoxArray *src;
  string *in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa30;
  string *levelPrefix_00;
  string *in_stack_fffffffffffffa40;
  BoxArray *in_stack_fffffffffffffa48;
  undefined8 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa6c;
  string *in_stack_fffffffffffffa70;
  string local_558 [32];
  MFInfo *local_538;
  undefined1 local_530 [184];
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb88;
  Real in_stack_fffffffffffffb90;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_stack_fffffffffffffb98;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffba0;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbb4;
  ostream *in_stack_fffffffffffffbb8;
  char *in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc14;
  string *in_stack_fffffffffffffc18;
  string *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  int local_374;
  int local_370;
  undefined1 local_369 [57];
  int local_330;
  ostream local_310 [512];
  string local_110 [39];
  allocator<char> local_e9 [41];
  string local_c0 [32];
  string local_a0 [32];
  reference local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  undefined8 local_68;
  undefined1 local_5d;
  int local_5c;
  int local_2c;
  char *local_20;
  undefined4 local_14;
  char *local_10;
  char *local_8;
  
  local_2c = in_ESI;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
             in_stack_fffffffffffff9f0,(size_type)in_stack_fffffffffffff9e8);
  bVar1 = FabArray<amrex::FArrayBox>::hasEBFabFactory(in_stack_fffffffffffffa00);
  if (!bVar1) {
    local_8 = "mf[0]->hasEBFabFactory()";
    local_10 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_PlotFileUtil.cpp"
    ;
    local_14 = 0x18b;
    local_20 = "\"EB_WriteMultiLevelPlotfile: does not have EB Factory\"";
    Assert_host((char *)in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,
                in_stack_fffffffffffffc14,in_stack_fffffffffffffc08);
  }
  local_5c = local_2c + -1;
  local_5d = 0;
  PreBuildDirectorHierarchy
            (in_stack_fffffffffffffa70,
             (string *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
             (int)((ulong)in_stack_fffffffffffffa60 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffa60 >> 0x18,0));
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffa00);
  if (!bVar1) {
    local_68 = in_stack_00000028;
    local_70._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff9e8);
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff9e8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff9f0,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff9e8), bVar1) {
      local_80 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_70);
      std::operator+(in_stack_fffffffffffffa18,&in_stack_fffffffffffffa10->alloc);
      std::operator+(in_stack_fffffffffffff9f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9f0);
      std::__cxx11::string::~string(local_c0);
      PreBuildDirectorHierarchy
                (in_stack_fffffffffffffa70,
                 (string *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                 (int)((ulong)in_stack_fffffffffffffa60 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffa60 >> 0x18,0));
      std::__cxx11::string::~string(local_a0);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_70);
    }
  }
  ParallelDescriptor::Barrier((string *)ParallelDescriptor::Unnamed_abi_cxx11_);
  bVar1 = ParallelDescriptor::IOProcessor();
  if (bVar1) {
    std::allocator<char>::allocator();
    Vector<char,_std::allocator<char>_>::vector
              ((Vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff9f0,
               (size_type)in_stack_fffffffffffff9e8,(allocator_type *)0x12eb6b6);
    std::allocator<char>::~allocator(local_e9);
    std::operator+(in_stack_fffffffffffffa18,&in_stack_fffffffffffffa10->alloc);
    std::ofstream::ofstream(local_310);
    pcVar5 = (char *)std::ofstream::rdbuf();
    pcVar6 = Vector<char,_std::allocator<char>_>::dataPtr
                       ((Vector<char,_std::allocator<char>_> *)0x12eb71e);
    Vector<char,_std::allocator<char>_>::size((Vector<char,_std::allocator<char>_> *)0x12eb733);
    std::streambuf::pubsetbuf(pcVar5,(long)pcVar6);
    _Var3 = std::__cxx11::string::c_str();
    __a = std::operator|(_S_out,_S_trunc);
    std::operator|(__a,_S_bin);
    std::ofstream::open((char *)local_310,_Var3);
    bVar2 = std::ios::good();
    if ((bVar2 & 1) == 0) {
      FileOpenFailed(in_stack_fffffffffffffa28);
    }
    std::allocator<amrex::BoxArray>::allocator((allocator<amrex::BoxArray> *)0x12eb886);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffff9f0,(size_type)in_stack_fffffffffffff9e8,
               (allocator_type *)0x12eb89d);
    std::allocator<amrex::BoxArray>::~allocator((allocator<amrex::BoxArray> *)0x12eb8ac);
    for (local_330 = 0; lVar7 = (long)local_330,
        LVar8 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::size
                          ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x12eb8d1),
        lVar7 < LVar8; local_330 = local_330 + 1) {
      ppMVar9 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
                operator[]((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                            *)in_stack_fffffffffffff9f0,(size_type)in_stack_fffffffffffff9e8);
      in_stack_fffffffffffffa48 = FabArrayBase::boxArray((FabArrayBase *)*ppMVar9);
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffff9f0,(size_type)in_stack_fffffffffffff9e8);
      BoxArray::operator=((BoxArray *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    }
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff9f0,
             (Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff9e8);
    in_stack_fffffffffffffa40 = (string *)local_369;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_369 + 1),"vfrac",(allocator *)in_stack_fffffffffffffa40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff9f0,(value_type *)in_stack_fffffffffffff9e8);
    std::__cxx11::string::~string((string *)(local_369 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_369);
    WriteGenericPlotfileHeader
              (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,in_stack_fffffffffffffba8,
               in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
               in_stack_fffffffffffffb88,
               (Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
               in_stack_fffffffffffffc18,in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
    for (local_370 = 0; local_370 < local_2c; local_370 = local_370 + 1) {
      std::operator<<(local_310,"1.0e-6\n");
    }
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x12ebb0d);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~Vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x12ebb1a);
    std::ofstream::~ofstream(local_310);
    std::__cxx11::string::~string(local_110);
    Vector<char,_std::allocator<char>_>::~Vector((Vector<char,_std::allocator<char>_> *)0x12ebb41);
    in_stack_fffffffffffff9e8 = in_stack_00000008;
    in_stack_fffffffffffff9f0 = in_stack_00000010;
  }
  local_374 = 0;
  while( true ) {
    if (local_5c < local_374) {
      return;
    }
    ppMVar9 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
                        ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          *)in_stack_fffffffffffff9f0,(size_type)in_stack_fffffffffffff9e8);
    iVar4 = FabArrayBase::nComp((FabArrayBase *)*ppMVar9);
    ppMVar9 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
                        ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          *)in_stack_fffffffffffff9f0,(size_type)in_stack_fffffffffffff9e8);
    dst = FabArrayBase::boxArray((FabArrayBase *)*ppMVar9);
    ppMVar9 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
                        ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          *)in_stack_fffffffffffff9f0,(size_type)in_stack_fffffffffffff9e8);
    bxs = (BoxArray *)FabArrayBase::DistributionMap((FabArrayBase *)*ppMVar9);
    iVar4 = iVar4 + 1;
    local_530._24_8_ = 0;
    local_530._32_8_ = 0;
    local_530._8_8_ = 0;
    local_530._16_8_ = 0;
    local_530._40_8_ = 0;
    levelPrefix_00 = (string *)(local_530 + 8);
    MFInfo::MFInfo((MFInfo *)0x12ebc4e);
    local_530._0_8_ = 0;
    in_stack_fffffffffffff9e8 = (BoxArray *)local_530;
    DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff9f0);
    src = in_stack_fffffffffffff9e8;
    MultiFab::MultiFab((MultiFab *)CONCAT44(iVar4,in_stack_fffffffffffffa30),bxs,
                       (DistributionMapping *)dst,(int)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                       (int)in_stack_fffffffffffff9e8,in_stack_fffffffffffffa10,
                       (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffa40);
    DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x12ebca9);
    MFInfo::~MFInfo((MFInfo *)0x12ebcb6);
    Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
              ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff9f0,(size_type)in_stack_fffffffffffff9e8);
    MultiFab::Copy((MultiFab *)dst,(MultiFab *)src,(int)((ulong)in_stack_fffffffffffffa10 >> 0x20),
                   (int)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                   in_stack_fffffffffffffa08);
    Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
              ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff9f0,(size_type)in_stack_fffffffffffff9e8);
    pFVar10 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x12ebd0b);
    in_stack_fffffffffffffa10 =
         (MFInfo *)
         __dynamic_cast(pFVar10,&FabFactory<amrex::FArrayBox>::typeinfo,
                        &EBFArrayBoxFactory::typeinfo,0);
    if (in_stack_fffffffffffffa10 == (MFInfo *)0x0) break;
    local_538 = in_stack_fffffffffffffa10;
    EBFArrayBoxFactory::getVolFrac(in_stack_fffffffffffff9f0);
    MultiFab::Copy((MultiFab *)dst,(MultiFab *)src,(int)((ulong)in_stack_fffffffffffffa10 >> 0x20),
                   (int)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                   in_stack_fffffffffffffa08);
    MultiFabFileFullPrefix
              ((int)((ulong)in_stack_fffffffffffffa48 >> 0x20),in_stack_fffffffffffffa40,
               levelPrefix_00,(string *)CONCAT44(iVar4,in_stack_fffffffffffffa30));
    VisMF::Write(in_stack_00000960,in_stack_00000958,in_stack_00000954,(bool)in_stack_00000953);
    std::__cxx11::string::~string(local_558);
    MultiFab::~MultiFab((MultiFab *)0x12ebddc);
    local_374 = local_374 + 1;
  }
  __cxa_bad_cast();
}

Assistant:

void
EB_WriteMultiLevelPlotfile (const std::string& plotfilename, int nlevels,
                            const Vector<const MultiFab*>& mf,
                            const Vector<std::string>& varnames,
                            const Vector<Geometry>& geom, Real time, const Vector<int>& level_steps,
                            const Vector<IntVect>& ref_ratio,
                            const std::string &versionName,
                            const std::string &levelPrefix,
                            const std::string &mfPrefix,
                            const Vector<std::string>& extra_dirs)
{
    BL_PROFILE("WriteMultiLevelPlotfile()");

    BL_ASSERT(nlevels <= mf.size());
    BL_ASSERT(nlevels <= geom.size());
    BL_ASSERT(nlevels <= ref_ratio.size()+1);
    BL_ASSERT(nlevels <= level_steps.size());
    BL_ASSERT(mf[0]->nComp() == varnames.size());
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(mf[0]->hasEBFabFactory(),
                                     "EB_WriteMultiLevelPlotfile: does not have EB Factory");

    int finest_level = nlevels-1;

//    int saveNFiles(VisMF::GetNOutFiles());
//    VisMF::SetNOutFiles(std::max(1024,saveNFiles));

    bool callBarrier(false);
    PreBuildDirectorHierarchy(plotfilename, levelPrefix, nlevels, callBarrier);
    if (!extra_dirs.empty()) {
        for (const auto& d : extra_dirs) {
            const std::string ed = plotfilename+"/"+d;
            amrex::PreBuildDirectorHierarchy(ed, levelPrefix, nlevels, callBarrier);
        }
    }
    ParallelDescriptor::Barrier();

    if (ParallelDescriptor::IOProcessor()) {
        VisMF::IO_Buffer io_buffer(VisMF::IO_Buffer_Size);
        std::string HeaderFileName(plotfilename + "/Header");
        std::ofstream HeaderFile;
        HeaderFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
        HeaderFile.open(HeaderFileName.c_str(), std::ofstream::out   |
                                                std::ofstream::trunc |
                                                std::ofstream::binary);
        if( ! HeaderFile.good()) {
            FileOpenFailed(HeaderFileName);
        }

        Vector<BoxArray> boxArrays(nlevels);
        for(int level(0); level < boxArrays.size(); ++level) {
            boxArrays[level] = mf[level]->boxArray();
        }

        Vector<std::string> vn = varnames;
        vn.push_back("vfrac");
        WriteGenericPlotfileHeader(HeaderFile, nlevels, boxArrays, vn,
                                   geom, time, level_steps, ref_ratio, versionName,
                                   levelPrefix, mfPrefix);

        for (int lev = 0; lev < nlevels; ++lev) {
            HeaderFile << "1.0e-6\n";
        }
    }


    for (int level = 0; level <= finest_level; ++level)
    {
        const int nc = mf[level]->nComp();
        MultiFab mf_tmp(mf[level]->boxArray(),
                        mf[level]->DistributionMap(),
                        nc+1, 0);
        MultiFab::Copy(mf_tmp, *mf[level], 0, 0, nc, 0);
        auto const& factory = dynamic_cast<EBFArrayBoxFactory const&>(mf[level]->Factory());
        MultiFab::Copy(mf_tmp, factory.getVolFrac(), 0, nc, 1, 0);
        VisMF::Write(mf_tmp, MultiFabFileFullPrefix(level, plotfilename, levelPrefix, mfPrefix));
    }

//    VisMF::SetNOutFiles(saveNFiles);
}